

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_group.hpp
# Opt level: O2

void __thiscall boost::thread_group::thread_group(thread_group *this)

{
  (this->threads).super__List_base<boost::thread_*,_std::allocator<boost::thread_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  (this->threads).super__List_base<boost::thread_*,_std::allocator<boost::thread_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)this;
  (this->threads).super__List_base<boost::thread_*,_std::allocator<boost::thread_*>_>._M_impl.
  _M_node._M_size = 0;
  shared_mutex::shared_mutex(&this->m);
  return;
}

Assistant:

thread_group() {}